

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmap.cpp
# Opt level: O2

uint32_t Interpret(vector<bool,_std::allocator<bool>_> *asmap,
                  vector<bool,_std::allocator<bool>_> *ip)

{
  uint uVar1;
  _Bit_type *p_Var2;
  const_reference cVar3;
  Instruction IVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  const_iterator local_58;
  const_iterator local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.super__Bit_iterator_base._M_p =
       (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p;
  local_48.super__Bit_iterator_base._M_offset = 0;
  p_Var2 = (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  uVar9 = (ulong)((*(int *)&(ip->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  *(int *)&(ip->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                 (ip->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                 _M_finish.super__Bit_iterator_base._M_offset);
  uVar7 = 0;
  local_58.super__Bit_iterator_base._M_p = p_Var2;
  local_58.super__Bit_iterator_base._M_offset = uVar1;
  do {
    if (((local_48.super__Bit_iterator_base._M_p == p_Var2) &&
        (local_48.super__Bit_iterator_base._M_offset == uVar1)) ||
       (IVar4 = anon_unknown.dwarf_40a80b8::DecodeType(&local_48,&local_58), DEFAULT < IVar4))
    goto LAB_00aec06e;
    switch(IVar4) {
    case RETURN:
      uVar7 = anon_unknown.dwarf_40a80b8::DecodeASN(&local_48,&local_58);
      if (uVar7 != 0xffffffff) {
LAB_00aec04d:
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return uVar7;
      }
      goto LAB_00aec06e;
    case JUMP:
      uVar5 = anon_unknown.dwarf_40a80b8::DecodeJump(&local_48,&local_58);
      if (((uVar5 == 0xffffffff) || ((char)uVar9 == '\0')) ||
         ((long)(((ulong)uVar1 - (ulong)local_48.super__Bit_iterator_base._M_offset) +
                ((long)p_Var2 - (long)local_48.super__Bit_iterator_base._M_p) * 8) <=
          (long)(ulong)uVar5)) goto LAB_00aec06e;
      cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (ip,((ulong)(ip->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                    _M_offset - (uVar9 & 0xff)) +
                            ((long)(ip->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                            - (long)(ip->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                            * 8);
      if (cVar3) {
        uVar8 = (ulong)local_48.super__Bit_iterator_base._M_offset + (ulong)uVar5;
        local_48.super__Bit_iterator_base._M_p =
             (_Bit_type *)
             ((long)local_48.super__Bit_iterator_base._M_p + (ulong)(uint)((int)(uVar8 >> 6) << 3));
        local_48.super__Bit_iterator_base._M_offset = (uint)uVar8 & 0x3f;
      }
      uVar9 = (ulong)(byte)((char)uVar9 - 1);
      break;
    case MATCH:
      uVar5 = anon_unknown.dwarf_40a80b8::DecodeMatch(&local_48,&local_58);
      if (uVar5 == 0xffffffff) goto LAB_00aec06e;
      uVar6 = 0x20;
      if (uVar5 != 0) {
        uVar6 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar6 = uVar6 ^ 0x1f;
      }
      if ((uint)(uVar9 & 0xff) < 0x1f - uVar6) goto LAB_00aec06e;
      for (uVar6 = 0x1e - uVar6; uVar6 != 0xffffffff; uVar6 = uVar6 - 1) {
        cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (ip,((ulong)(ip->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                      _M_offset - (uVar9 & 0xff)) +
                              ((long)(ip->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                     _M_p -
                              (long)(ip->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                              * 8);
        if (cVar3 != ((uVar5 >> (uVar6 & 0x1f) & 1) != 0)) goto LAB_00aec04d;
        uVar9 = (ulong)(byte)((char)uVar9 - 1);
      }
      break;
    case DEFAULT:
      uVar7 = anon_unknown.dwarf_40a80b8::DecodeASN(&local_48,&local_58);
      if (uVar7 == 0xffffffff) {
LAB_00aec06e:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/asmap.cpp"
                      ,0x81,
                      "uint32_t Interpret(const std::vector<bool> &, const std::vector<bool> &)");
      }
    }
  } while( true );
}

Assistant:

uint32_t Interpret(const std::vector<bool> &asmap, const std::vector<bool> &ip)
{
    std::vector<bool>::const_iterator pos = asmap.begin();
    const std::vector<bool>::const_iterator endpos = asmap.end();
    uint8_t bits = ip.size();
    uint32_t default_asn = 0;
    uint32_t jump, match, matchlen;
    Instruction opcode;
    while (pos != endpos) {
        opcode = DecodeType(pos, endpos);
        if (opcode == Instruction::RETURN) {
            default_asn = DecodeASN(pos, endpos);
            if (default_asn == INVALID) break; // ASN straddles EOF
            return default_asn;
        } else if (opcode == Instruction::JUMP) {
            jump = DecodeJump(pos, endpos);
            if (jump == INVALID) break; // Jump offset straddles EOF
            if (bits == 0) break; // No input bits left
            if (int64_t{jump} >= int64_t{endpos - pos}) break; // Jumping past EOF
            if (ip[ip.size() - bits]) {
                pos += jump;
            }
            bits--;
        } else if (opcode == Instruction::MATCH) {
            match = DecodeMatch(pos, endpos);
            if (match == INVALID) break; // Match bits straddle EOF
            matchlen = std::bit_width(match) - 1;
            if (bits < matchlen) break; // Not enough input bits
            for (uint32_t bit = 0; bit < matchlen; bit++) {
                if ((ip[ip.size() - bits]) != ((match >> (matchlen - 1 - bit)) & 1)) {
                    return default_asn;
                }
                bits--;
            }
        } else if (opcode == Instruction::DEFAULT) {
            default_asn = DecodeASN(pos, endpos);
            if (default_asn == INVALID) break; // ASN straddles EOF
        } else {
            break; // Instruction straddles EOF
        }
    }
    assert(false); // Reached EOF without RETURN, or aborted (see any of the breaks above) - should have been caught by SanityCheckASMap below
    return 0; // 0 is not a valid ASN
}